

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__vertical_gather_with_8_coeffs_cont
               (float *outputp,float *vertical_coefficients,float **inputs,float *input0_end)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float o0_2;
  __m128 r0_1;
  __m128 o0_1;
  __m128 r3;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 o3;
  __m128 o2;
  __m128 o1;
  __m128 o0;
  __m128 c7;
  __m128 c6;
  __m128 c5;
  __m128 c4;
  __m128 c3;
  __m128 c2;
  __m128 c1;
  __m128 c0;
  float *pfStack_dd0;
  float c7s;
  float *input7;
  float *pfStack_dc0;
  float c6s;
  float *input6;
  float *pfStack_db0;
  float c5s;
  float *input5;
  float *pfStack_da0;
  float c4s;
  float *input4;
  float *pfStack_d90;
  float c3s;
  float *input3;
  float *pfStack_d80;
  float c2s;
  float *input2;
  float *pfStack_d70;
  float c1s;
  float *input1;
  float *pfStack_d60;
  float c0s;
  float *input0;
  float *output;
  float *input0_end_local;
  float **inputs_local;
  float *vertical_coefficients_local;
  float *outputp_local;
  float local_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float local_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float local_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float local_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float local_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float local_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float local_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float local_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float local_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float local_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float local_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float local_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float local_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float local_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float local_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float local_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float local_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float local_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float local_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float local_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  
  fVar1 = *vertical_coefficients;
  pfStack_d70 = inputs[1];
  fVar2 = vertical_coefficients[1];
  pfStack_d80 = inputs[2];
  fVar3 = vertical_coefficients[2];
  pfStack_d90 = inputs[3];
  fVar4 = vertical_coefficients[3];
  pfStack_da0 = inputs[4];
  fVar5 = vertical_coefficients[4];
  pfStack_db0 = inputs[5];
  fVar6 = vertical_coefficients[5];
  pfStack_dc0 = inputs[6];
  fVar7 = vertical_coefficients[6];
  pfStack_dd0 = inputs[7];
  fVar8 = vertical_coefficients[7];
  input0 = outputp;
  for (pfStack_d60 = *inputs; 0x3f < (long)input0_end - (long)pfStack_d60;
      pfStack_d60 = pfStack_d60 + 0x10) {
    local_638 = (float)*(undefined8 *)pfStack_d60;
    fStack_634 = (float)((ulong)*(undefined8 *)pfStack_d60 >> 0x20);
    fStack_630 = (float)*(undefined8 *)(pfStack_d60 + 2);
    fStack_62c = (float)((ulong)*(undefined8 *)(pfStack_d60 + 2) >> 0x20);
    local_138 = (float)*(undefined8 *)input0;
    fStack_134 = (float)((ulong)*(undefined8 *)input0 >> 0x20);
    fStack_130 = (float)*(undefined8 *)(input0 + 2);
    fStack_12c = (float)((ulong)*(undefined8 *)(input0 + 2) >> 0x20);
    local_658 = (float)*(undefined8 *)(pfStack_d60 + 4);
    fStack_654 = (float)((ulong)*(undefined8 *)(pfStack_d60 + 4) >> 0x20);
    fStack_650 = (float)*(undefined8 *)(pfStack_d60 + 6);
    fStack_64c = (float)((ulong)*(undefined8 *)(pfStack_d60 + 6) >> 0x20);
    local_158 = (float)*(undefined8 *)(input0 + 4);
    fStack_154 = (float)((ulong)*(undefined8 *)(input0 + 4) >> 0x20);
    fStack_150 = (float)*(undefined8 *)(input0 + 6);
    fStack_14c = (float)((ulong)*(undefined8 *)(input0 + 6) >> 0x20);
    local_678 = (float)*(undefined8 *)(pfStack_d60 + 8);
    fStack_674 = (float)((ulong)*(undefined8 *)(pfStack_d60 + 8) >> 0x20);
    fStack_670 = (float)*(undefined8 *)(pfStack_d60 + 10);
    fStack_66c = (float)((ulong)*(undefined8 *)(pfStack_d60 + 10) >> 0x20);
    local_178 = (float)*(undefined8 *)(input0 + 8);
    fStack_174 = (float)((ulong)*(undefined8 *)(input0 + 8) >> 0x20);
    fStack_170 = (float)*(undefined8 *)(input0 + 10);
    fStack_16c = (float)((ulong)*(undefined8 *)(input0 + 10) >> 0x20);
    local_698 = (float)*(undefined8 *)(pfStack_d60 + 0xc);
    fStack_694 = (float)((ulong)*(undefined8 *)(pfStack_d60 + 0xc) >> 0x20);
    fStack_690 = (float)*(undefined8 *)(pfStack_d60 + 0xe);
    fStack_68c = (float)((ulong)*(undefined8 *)(pfStack_d60 + 0xe) >> 0x20);
    local_198 = (float)*(undefined8 *)(input0 + 0xc);
    fStack_194 = (float)((ulong)*(undefined8 *)(input0 + 0xc) >> 0x20);
    fStack_190 = (float)*(undefined8 *)(input0 + 0xe);
    fStack_18c = (float)((ulong)*(undefined8 *)(input0 + 0xe) >> 0x20);
    local_6b8 = (float)*(undefined8 *)pfStack_d70;
    fStack_6b4 = (float)((ulong)*(undefined8 *)pfStack_d70 >> 0x20);
    fStack_6b0 = (float)*(undefined8 *)(pfStack_d70 + 2);
    fStack_6ac = (float)((ulong)*(undefined8 *)(pfStack_d70 + 2) >> 0x20);
    local_6d8 = (float)*(undefined8 *)(pfStack_d70 + 4);
    fStack_6d4 = (float)((ulong)*(undefined8 *)(pfStack_d70 + 4) >> 0x20);
    fStack_6d0 = (float)*(undefined8 *)(pfStack_d70 + 6);
    fStack_6cc = (float)((ulong)*(undefined8 *)(pfStack_d70 + 6) >> 0x20);
    local_6f8 = (float)*(undefined8 *)(pfStack_d70 + 8);
    fStack_6f4 = (float)((ulong)*(undefined8 *)(pfStack_d70 + 8) >> 0x20);
    fStack_6f0 = (float)*(undefined8 *)(pfStack_d70 + 10);
    fStack_6ec = (float)((ulong)*(undefined8 *)(pfStack_d70 + 10) >> 0x20);
    local_718 = (float)*(undefined8 *)(pfStack_d70 + 0xc);
    fStack_714 = (float)((ulong)*(undefined8 *)(pfStack_d70 + 0xc) >> 0x20);
    fStack_710 = (float)*(undefined8 *)(pfStack_d70 + 0xe);
    fStack_70c = (float)((ulong)*(undefined8 *)(pfStack_d70 + 0xe) >> 0x20);
    local_738 = (float)*(undefined8 *)pfStack_d80;
    fStack_734 = (float)((ulong)*(undefined8 *)pfStack_d80 >> 0x20);
    fStack_730 = (float)*(undefined8 *)(pfStack_d80 + 2);
    fStack_72c = (float)((ulong)*(undefined8 *)(pfStack_d80 + 2) >> 0x20);
    local_758 = (float)*(undefined8 *)(pfStack_d80 + 4);
    fStack_754 = (float)((ulong)*(undefined8 *)(pfStack_d80 + 4) >> 0x20);
    fStack_750 = (float)*(undefined8 *)(pfStack_d80 + 6);
    fStack_74c = (float)((ulong)*(undefined8 *)(pfStack_d80 + 6) >> 0x20);
    local_778 = (float)*(undefined8 *)(pfStack_d80 + 8);
    fStack_774 = (float)((ulong)*(undefined8 *)(pfStack_d80 + 8) >> 0x20);
    fStack_770 = (float)*(undefined8 *)(pfStack_d80 + 10);
    fStack_76c = (float)((ulong)*(undefined8 *)(pfStack_d80 + 10) >> 0x20);
    local_798 = (float)*(undefined8 *)(pfStack_d80 + 0xc);
    fStack_794 = (float)((ulong)*(undefined8 *)(pfStack_d80 + 0xc) >> 0x20);
    fStack_790 = (float)*(undefined8 *)(pfStack_d80 + 0xe);
    fStack_78c = (float)((ulong)*(undefined8 *)(pfStack_d80 + 0xe) >> 0x20);
    local_7b8 = (float)*(undefined8 *)pfStack_d90;
    fStack_7b4 = (float)((ulong)*(undefined8 *)pfStack_d90 >> 0x20);
    fStack_7b0 = (float)*(undefined8 *)(pfStack_d90 + 2);
    fStack_7ac = (float)((ulong)*(undefined8 *)(pfStack_d90 + 2) >> 0x20);
    local_7d8 = (float)*(undefined8 *)(pfStack_d90 + 4);
    fStack_7d4 = (float)((ulong)*(undefined8 *)(pfStack_d90 + 4) >> 0x20);
    fStack_7d0 = (float)*(undefined8 *)(pfStack_d90 + 6);
    fStack_7cc = (float)((ulong)*(undefined8 *)(pfStack_d90 + 6) >> 0x20);
    local_7f8 = (float)*(undefined8 *)(pfStack_d90 + 8);
    fStack_7f4 = (float)((ulong)*(undefined8 *)(pfStack_d90 + 8) >> 0x20);
    fStack_7f0 = (float)*(undefined8 *)(pfStack_d90 + 10);
    fStack_7ec = (float)((ulong)*(undefined8 *)(pfStack_d90 + 10) >> 0x20);
    local_818 = (float)*(undefined8 *)(pfStack_d90 + 0xc);
    fStack_814 = (float)((ulong)*(undefined8 *)(pfStack_d90 + 0xc) >> 0x20);
    fStack_810 = (float)*(undefined8 *)(pfStack_d90 + 0xe);
    fStack_80c = (float)((ulong)*(undefined8 *)(pfStack_d90 + 0xe) >> 0x20);
    local_838 = (float)*(undefined8 *)pfStack_da0;
    fStack_834 = (float)((ulong)*(undefined8 *)pfStack_da0 >> 0x20);
    fStack_830 = (float)*(undefined8 *)(pfStack_da0 + 2);
    fStack_82c = (float)((ulong)*(undefined8 *)(pfStack_da0 + 2) >> 0x20);
    local_858 = (float)*(undefined8 *)(pfStack_da0 + 4);
    fStack_854 = (float)((ulong)*(undefined8 *)(pfStack_da0 + 4) >> 0x20);
    fStack_850 = (float)*(undefined8 *)(pfStack_da0 + 6);
    fStack_84c = (float)((ulong)*(undefined8 *)(pfStack_da0 + 6) >> 0x20);
    local_878 = (float)*(undefined8 *)(pfStack_da0 + 8);
    fStack_874 = (float)((ulong)*(undefined8 *)(pfStack_da0 + 8) >> 0x20);
    fStack_870 = (float)*(undefined8 *)(pfStack_da0 + 10);
    fStack_86c = (float)((ulong)*(undefined8 *)(pfStack_da0 + 10) >> 0x20);
    local_898 = (float)*(undefined8 *)(pfStack_da0 + 0xc);
    fStack_894 = (float)((ulong)*(undefined8 *)(pfStack_da0 + 0xc) >> 0x20);
    fStack_890 = (float)*(undefined8 *)(pfStack_da0 + 0xe);
    fStack_88c = (float)((ulong)*(undefined8 *)(pfStack_da0 + 0xe) >> 0x20);
    local_8b8 = (float)*(undefined8 *)pfStack_db0;
    fStack_8b4 = (float)((ulong)*(undefined8 *)pfStack_db0 >> 0x20);
    fStack_8b0 = (float)*(undefined8 *)(pfStack_db0 + 2);
    fStack_8ac = (float)((ulong)*(undefined8 *)(pfStack_db0 + 2) >> 0x20);
    local_8d8 = (float)*(undefined8 *)(pfStack_db0 + 4);
    fStack_8d4 = (float)((ulong)*(undefined8 *)(pfStack_db0 + 4) >> 0x20);
    fStack_8d0 = (float)*(undefined8 *)(pfStack_db0 + 6);
    fStack_8cc = (float)((ulong)*(undefined8 *)(pfStack_db0 + 6) >> 0x20);
    local_8f8 = (float)*(undefined8 *)(pfStack_db0 + 8);
    fStack_8f4 = (float)((ulong)*(undefined8 *)(pfStack_db0 + 8) >> 0x20);
    fStack_8f0 = (float)*(undefined8 *)(pfStack_db0 + 10);
    fStack_8ec = (float)((ulong)*(undefined8 *)(pfStack_db0 + 10) >> 0x20);
    local_918 = (float)*(undefined8 *)(pfStack_db0 + 0xc);
    fStack_914 = (float)((ulong)*(undefined8 *)(pfStack_db0 + 0xc) >> 0x20);
    fStack_910 = (float)*(undefined8 *)(pfStack_db0 + 0xe);
    fStack_90c = (float)((ulong)*(undefined8 *)(pfStack_db0 + 0xe) >> 0x20);
    local_938 = (float)*(undefined8 *)pfStack_dc0;
    fStack_934 = (float)((ulong)*(undefined8 *)pfStack_dc0 >> 0x20);
    fStack_930 = (float)*(undefined8 *)(pfStack_dc0 + 2);
    fStack_92c = (float)((ulong)*(undefined8 *)(pfStack_dc0 + 2) >> 0x20);
    local_958 = (float)*(undefined8 *)(pfStack_dc0 + 4);
    fStack_954 = (float)((ulong)*(undefined8 *)(pfStack_dc0 + 4) >> 0x20);
    fStack_950 = (float)*(undefined8 *)(pfStack_dc0 + 6);
    fStack_94c = (float)((ulong)*(undefined8 *)(pfStack_dc0 + 6) >> 0x20);
    local_978 = (float)*(undefined8 *)(pfStack_dc0 + 8);
    fStack_974 = (float)((ulong)*(undefined8 *)(pfStack_dc0 + 8) >> 0x20);
    fStack_970 = (float)*(undefined8 *)(pfStack_dc0 + 10);
    fStack_96c = (float)((ulong)*(undefined8 *)(pfStack_dc0 + 10) >> 0x20);
    local_998 = (float)*(undefined8 *)(pfStack_dc0 + 0xc);
    fStack_994 = (float)((ulong)*(undefined8 *)(pfStack_dc0 + 0xc) >> 0x20);
    fStack_990 = (float)*(undefined8 *)(pfStack_dc0 + 0xe);
    fStack_98c = (float)((ulong)*(undefined8 *)(pfStack_dc0 + 0xe) >> 0x20);
    local_9b8 = (float)*(undefined8 *)pfStack_dd0;
    fStack_9b4 = (float)((ulong)*(undefined8 *)pfStack_dd0 >> 0x20);
    fStack_9b0 = (float)*(undefined8 *)(pfStack_dd0 + 2);
    fStack_9ac = (float)((ulong)*(undefined8 *)(pfStack_dd0 + 2) >> 0x20);
    o1[3] = fStack_134 + fStack_634 * fVar1 + fStack_6b4 * fVar2 + fStack_734 * fVar3 +
            fStack_7b4 * fVar4 + fStack_834 * fVar5 + fStack_8b4 * fVar6 + fStack_934 * fVar7 +
            fStack_9b4 * fVar8;
    o1[2] = local_138 + local_638 * fVar1 + local_6b8 * fVar2 + local_738 * fVar3 +
            local_7b8 * fVar4 + local_838 * fVar5 + local_8b8 * fVar6 + local_938 * fVar7 +
            local_9b8 * fVar8;
    o0[1] = fStack_12c + fStack_62c * fVar1 + fStack_6ac * fVar2 + fStack_72c * fVar3 +
            fStack_7ac * fVar4 + fStack_82c * fVar5 + fStack_8ac * fVar6 + fStack_92c * fVar7 +
            fStack_9ac * fVar8;
    o0[0] = fStack_130 + fStack_630 * fVar1 + fStack_6b0 * fVar2 + fStack_730 * fVar3 +
            fStack_7b0 * fVar4 + fStack_830 * fVar5 + fStack_8b0 * fVar6 + fStack_930 * fVar7 +
            fStack_9b0 * fVar8;
    local_9d8 = (float)*(undefined8 *)(pfStack_dd0 + 4);
    fStack_9d4 = (float)((ulong)*(undefined8 *)(pfStack_dd0 + 4) >> 0x20);
    fStack_9d0 = (float)*(undefined8 *)(pfStack_dd0 + 6);
    fStack_9cc = (float)((ulong)*(undefined8 *)(pfStack_dd0 + 6) >> 0x20);
    o2[3] = fStack_154 + fStack_654 * fVar1 + fStack_6d4 * fVar2 + fStack_754 * fVar3 +
            fStack_7d4 * fVar4 + fStack_854 * fVar5 + fStack_8d4 * fVar6 + fStack_954 * fVar7 +
            fStack_9d4 * fVar8;
    o2[2] = local_158 + local_658 * fVar1 + local_6d8 * fVar2 + local_758 * fVar3 +
            local_7d8 * fVar4 + local_858 * fVar5 + local_8d8 * fVar6 + local_958 * fVar7 +
            local_9d8 * fVar8;
    o1[1] = fStack_14c + fStack_64c * fVar1 + fStack_6cc * fVar2 + fStack_74c * fVar3 +
            fStack_7cc * fVar4 + fStack_84c * fVar5 + fStack_8cc * fVar6 + fStack_94c * fVar7 +
            fStack_9cc * fVar8;
    o1[0] = fStack_150 + fStack_650 * fVar1 + fStack_6d0 * fVar2 + fStack_750 * fVar3 +
            fStack_7d0 * fVar4 + fStack_850 * fVar5 + fStack_8d0 * fVar6 + fStack_950 * fVar7 +
            fStack_9d0 * fVar8;
    local_9f8 = (float)*(undefined8 *)(pfStack_dd0 + 8);
    fStack_9f4 = (float)((ulong)*(undefined8 *)(pfStack_dd0 + 8) >> 0x20);
    fStack_9f0 = (float)*(undefined8 *)(pfStack_dd0 + 10);
    fStack_9ec = (float)((ulong)*(undefined8 *)(pfStack_dd0 + 10) >> 0x20);
    o3[3] = fStack_174 + fStack_674 * fVar1 + fStack_6f4 * fVar2 + fStack_774 * fVar3 +
            fStack_7f4 * fVar4 + fStack_874 * fVar5 + fStack_8f4 * fVar6 + fStack_974 * fVar7 +
            fStack_9f4 * fVar8;
    o3[2] = local_178 + local_678 * fVar1 + local_6f8 * fVar2 + local_778 * fVar3 +
            local_7f8 * fVar4 + local_878 * fVar5 + local_8f8 * fVar6 + local_978 * fVar7 +
            local_9f8 * fVar8;
    o2[1] = fStack_16c + fStack_66c * fVar1 + fStack_6ec * fVar2 + fStack_76c * fVar3 +
            fStack_7ec * fVar4 + fStack_86c * fVar5 + fStack_8ec * fVar6 + fStack_96c * fVar7 +
            fStack_9ec * fVar8;
    o2[0] = fStack_170 + fStack_670 * fVar1 + fStack_6f0 * fVar2 + fStack_770 * fVar3 +
            fStack_7f0 * fVar4 + fStack_870 * fVar5 + fStack_8f0 * fVar6 + fStack_970 * fVar7 +
            fStack_9f0 * fVar8;
    local_a18 = (float)*(undefined8 *)(pfStack_dd0 + 0xc);
    fStack_a14 = (float)((ulong)*(undefined8 *)(pfStack_dd0 + 0xc) >> 0x20);
    fStack_a10 = (float)*(undefined8 *)(pfStack_dd0 + 0xe);
    fStack_a0c = (float)((ulong)*(undefined8 *)(pfStack_dd0 + 0xe) >> 0x20);
    r0[3] = fStack_194 + fStack_694 * fVar1 + fStack_714 * fVar2 + fStack_794 * fVar3 +
            fStack_814 * fVar4 + fStack_894 * fVar5 + fStack_914 * fVar6 + fStack_994 * fVar7 +
            fStack_a14 * fVar8;
    r0[2] = local_198 + local_698 * fVar1 + local_718 * fVar2 + local_798 * fVar3 +
            local_818 * fVar4 + local_898 * fVar5 + local_918 * fVar6 + local_998 * fVar7 +
            local_a18 * fVar8;
    o3[1] = fStack_18c + fStack_68c * fVar1 + fStack_70c * fVar2 + fStack_78c * fVar3 +
            fStack_80c * fVar4 + fStack_88c * fVar5 + fStack_90c * fVar6 + fStack_98c * fVar7 +
            fStack_a0c * fVar8;
    o3[0] = fStack_190 + fStack_690 * fVar1 + fStack_710 * fVar2 + fStack_790 * fVar3 +
            fStack_810 * fVar4 + fStack_890 * fVar5 + fStack_910 * fVar6 + fStack_990 * fVar7 +
            fStack_a10 * fVar8;
    *(undefined8 *)input0 = o1._8_8_;
    *(undefined8 *)(input0 + 2) = o0._0_8_;
    *(undefined8 *)(input0 + 4) = o2._8_8_;
    *(undefined8 *)(input0 + 6) = o1._0_8_;
    *(undefined8 *)(input0 + 8) = o3._8_8_;
    *(undefined8 *)(input0 + 10) = o2._0_8_;
    *(undefined8 *)(input0 + 0xc) = r0._8_8_;
    *(undefined8 *)(input0 + 0xe) = o3._0_8_;
    input0 = input0 + 0x10;
    pfStack_d70 = pfStack_d70 + 0x10;
    pfStack_d80 = pfStack_d80 + 0x10;
    pfStack_d90 = pfStack_d90 + 0x10;
    pfStack_da0 = pfStack_da0 + 0x10;
    pfStack_db0 = pfStack_db0 + 0x10;
    pfStack_dc0 = pfStack_dc0 + 0x10;
    pfStack_dd0 = pfStack_dd0 + 0x10;
  }
  for (; 0xf < (long)input0_end - (long)pfStack_d60; pfStack_d60 = pfStack_d60 + 4) {
    local_a38 = (float)*(undefined8 *)pfStack_d60;
    fStack_a34 = (float)((ulong)*(undefined8 *)pfStack_d60 >> 0x20);
    fStack_a30 = (float)*(undefined8 *)(pfStack_d60 + 2);
    fStack_a2c = (float)((ulong)*(undefined8 *)(pfStack_d60 + 2) >> 0x20);
    local_538 = (float)*(undefined8 *)input0;
    fStack_534 = (float)((ulong)*(undefined8 *)input0 >> 0x20);
    fStack_530 = (float)*(undefined8 *)(input0 + 2);
    fStack_52c = (float)((ulong)*(undefined8 *)(input0 + 2) >> 0x20);
    local_a58 = (float)*(undefined8 *)pfStack_d70;
    fStack_a54 = (float)((ulong)*(undefined8 *)pfStack_d70 >> 0x20);
    fStack_a50 = (float)*(undefined8 *)(pfStack_d70 + 2);
    fStack_a4c = (float)((ulong)*(undefined8 *)(pfStack_d70 + 2) >> 0x20);
    local_a78 = (float)*(undefined8 *)pfStack_d80;
    fStack_a74 = (float)((ulong)*(undefined8 *)pfStack_d80 >> 0x20);
    fStack_a70 = (float)*(undefined8 *)(pfStack_d80 + 2);
    fStack_a6c = (float)((ulong)*(undefined8 *)(pfStack_d80 + 2) >> 0x20);
    local_a98 = (float)*(undefined8 *)pfStack_d90;
    fStack_a94 = (float)((ulong)*(undefined8 *)pfStack_d90 >> 0x20);
    fStack_a90 = (float)*(undefined8 *)(pfStack_d90 + 2);
    fStack_a8c = (float)((ulong)*(undefined8 *)(pfStack_d90 + 2) >> 0x20);
    local_ab8 = (float)*(undefined8 *)pfStack_da0;
    fStack_ab4 = (float)((ulong)*(undefined8 *)pfStack_da0 >> 0x20);
    fStack_ab0 = (float)*(undefined8 *)(pfStack_da0 + 2);
    fStack_aac = (float)((ulong)*(undefined8 *)(pfStack_da0 + 2) >> 0x20);
    local_ad8 = (float)*(undefined8 *)pfStack_db0;
    fStack_ad4 = (float)((ulong)*(undefined8 *)pfStack_db0 >> 0x20);
    fStack_ad0 = (float)*(undefined8 *)(pfStack_db0 + 2);
    fStack_acc = (float)((ulong)*(undefined8 *)(pfStack_db0 + 2) >> 0x20);
    local_af8 = (float)*(undefined8 *)pfStack_dc0;
    fStack_af4 = (float)((ulong)*(undefined8 *)pfStack_dc0 >> 0x20);
    fStack_af0 = (float)*(undefined8 *)(pfStack_dc0 + 2);
    fStack_aec = (float)((ulong)*(undefined8 *)(pfStack_dc0 + 2) >> 0x20);
    local_b18 = (float)*(undefined8 *)pfStack_dd0;
    fStack_b14 = (float)((ulong)*(undefined8 *)pfStack_dd0 >> 0x20);
    fStack_b10 = (float)*(undefined8 *)(pfStack_dd0 + 2);
    fStack_b0c = (float)((ulong)*(undefined8 *)(pfStack_dd0 + 2) >> 0x20);
    r0_1[3] = fStack_534 + fStack_a34 * fVar1 + fStack_a54 * fVar2 + fStack_a74 * fVar3 +
              fStack_a94 * fVar4 + fStack_ab4 * fVar5 + fStack_ad4 * fVar6 + fStack_af4 * fVar7 +
              fStack_b14 * fVar8;
    r0_1[2] = local_538 + local_a38 * fVar1 + local_a58 * fVar2 + local_a78 * fVar3 +
              local_a98 * fVar4 + local_ab8 * fVar5 + local_ad8 * fVar6 + local_af8 * fVar7 +
              local_b18 * fVar8;
    o0_1[1] = fStack_52c + fStack_a2c * fVar1 + fStack_a4c * fVar2 + fStack_a6c * fVar3 +
              fStack_a8c * fVar4 + fStack_aac * fVar5 + fStack_acc * fVar6 + fStack_aec * fVar7 +
              fStack_b0c * fVar8;
    o0_1[0] = fStack_530 + fStack_a30 * fVar1 + fStack_a50 * fVar2 + fStack_a70 * fVar3 +
              fStack_a90 * fVar4 + fStack_ab0 * fVar5 + fStack_ad0 * fVar6 + fStack_af0 * fVar7 +
              fStack_b10 * fVar8;
    *(undefined8 *)input0 = r0_1._8_8_;
    *(undefined8 *)(input0 + 2) = o0_1._0_8_;
    input0 = input0 + 4;
    pfStack_d70 = pfStack_d70 + 4;
    pfStack_d80 = pfStack_d80 + 4;
    pfStack_d90 = pfStack_d90 + 4;
    pfStack_da0 = pfStack_da0 + 4;
    pfStack_db0 = pfStack_db0 + 4;
    pfStack_dc0 = pfStack_dc0 + 4;
    pfStack_dd0 = pfStack_dd0 + 4;
  }
  for (; pfStack_d60 < input0_end; pfStack_d60 = pfStack_d60 + 1) {
    *input0 = *pfStack_dd0 * fVar8 +
              *pfStack_dc0 * fVar7 +
              *pfStack_db0 * fVar6 +
              *pfStack_da0 * fVar5 +
              *pfStack_d90 * fVar4 +
              *pfStack_d80 * fVar3 + *pfStack_d70 * fVar2 + *input0 + *pfStack_d60 * fVar1;
    input0 = input0 + 1;
    pfStack_d70 = pfStack_d70 + 1;
    pfStack_d80 = pfStack_d80 + 1;
    pfStack_d90 = pfStack_d90 + 1;
    pfStack_da0 = pfStack_da0 + 1;
    pfStack_db0 = pfStack_db0 + 1;
    pfStack_dc0 = pfStack_dc0 + 1;
    pfStack_dd0 = pfStack_dd0 + 1;
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_gather_with_,_coeffs)( float * outputp, float const * vertical_coefficients, float const ** inputs, float const * input0_end )
{
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = outputp;

  stbIF0( float const * input0 = inputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float const * input1 = inputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float const * input2 = inputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float const * input3 = inputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float const * input4 = inputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float const * input5 = inputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float const * input6 = inputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float const * input7 = inputs[7]; float c7s = vertical_coefficients[7]; )

#if ( STBIR__vertical_channels == 1 ) && !defined(STB_IMAGE_RESIZE_VERTICAL_CONTINUE)
  // check single channel one weight
  if ( ( c0s >= (1.0f-0.000001f) ) && ( c0s <= (1.0f+0.000001f) ) )
  {
    STBIR_MEMCPY( output, input0, (char*)input0_end - (char*)input0 );
    return;
  }
#endif

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output);

      // prefetch four loop iterations ahead (doesn't affect much for small resizes, but helps with big ones)
      stbIF0( stbir__prefetch( input0 + (16*stbir__simdfX_float_count) ); )
      stbIF1( stbir__prefetch( input1 + (16*stbir__simdfX_float_count) ); )
      stbIF2( stbir__prefetch( input2 + (16*stbir__simdfX_float_count) ); )
      stbIF3( stbir__prefetch( input3 + (16*stbir__simdfX_float_count) ); )
      stbIF4( stbir__prefetch( input4 + (16*stbir__simdfX_float_count) ); )
      stbIF5( stbir__prefetch( input5 + (16*stbir__simdfX_float_count) ); )
      stbIF6( stbir__prefetch( input6 + (16*stbir__simdfX_float_count) ); )
      stbIF7( stbir__prefetch( input7 + (16*stbir__simdfX_float_count) ); )

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output );      stbir__simdfX_load( o1, output+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( o3, output+(3*stbir__simdfX_float_count) );
              stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );                         stbir__simdfX_madd( o2, o2, r2, c0 );                             stbir__simdfX_madd( o3, o3, r3, c0 ); )
      #else
      stbIF0( stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );                             stbir__simdfX_mult( o2, r2, c0 );                                 stbir__simdfX_mult( o3, r3, c0 );  )
      #endif

      stbIF1( stbir__simdfX_load( r0, input1 );      stbir__simdfX_load( r1, input1+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input1+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );                         stbir__simdfX_madd( o2, o2, r2, c1 );                             stbir__simdfX_madd( o3, o3, r3, c1 ); )
      stbIF2( stbir__simdfX_load( r0, input2 );      stbir__simdfX_load( r1, input2+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input2+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );                         stbir__simdfX_madd( o2, o2, r2, c2 );                             stbir__simdfX_madd( o3, o3, r3, c2 ); )
      stbIF3( stbir__simdfX_load( r0, input3 );      stbir__simdfX_load( r1, input3+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input3+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );                         stbir__simdfX_madd( o2, o2, r2, c3 );                             stbir__simdfX_madd( o3, o3, r3, c3 ); )
      stbIF4( stbir__simdfX_load( r0, input4 );      stbir__simdfX_load( r1, input4+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input4+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );                         stbir__simdfX_madd( o2, o2, r2, c4 );                             stbir__simdfX_madd( o3, o3, r3, c4 ); )
      stbIF5( stbir__simdfX_load( r0, input5 );      stbir__simdfX_load( r1, input5+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input5+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );                         stbir__simdfX_madd( o2, o2, r2, c5 );                             stbir__simdfX_madd( o3, o3, r3, c5 ); )
      stbIF6( stbir__simdfX_load( r0, input6 );      stbir__simdfX_load( r1, input6+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input6+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );                         stbir__simdfX_madd( o2, o2, r2, c6 );                             stbir__simdfX_madd( o3, o3, r3, c6 ); )
      stbIF7( stbir__simdfX_load( r0, input7 );      stbir__simdfX_load( r1, input7+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input7+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );                         stbir__simdfX_madd( o2, o2, r2, c7 );                             stbir__simdfX_madd( o3, o3, r3, c7 ); )

      stbir__simdfX_store( output, o0 );             stbir__simdfX_store( output+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output+(2*stbir__simdfX_float_count), o2 );  stbir__simdfX_store( output+(3*stbir__simdfX_float_count), o3 );
      output += (4*stbir__simdfX_float_count);
      stbIF0( input0 += (4*stbir__simdfX_float_count); ) stbIF1( input1 += (4*stbir__simdfX_float_count); ) stbIF2( input2 += (4*stbir__simdfX_float_count); ) stbIF3( input3 += (4*stbir__simdfX_float_count); ) stbIF4( input4 += (4*stbir__simdfX_float_count); ) stbIF5( input5 += (4*stbir__simdfX_float_count); ) stbIF6( input6 += (4*stbir__simdfX_float_count); ) stbIF7( input7 += (4*stbir__simdfX_float_count); )
    }

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output);

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output );   stbir__simdf_load( r0, input0 ); stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #else
      stbIF0( stbir__simdf_load( r0, input0 );  stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #endif
      stbIF1( stbir__simdf_load( r0, input1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) ); )
      stbIF2( stbir__simdf_load( r0, input2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) ); )
      stbIF3( stbir__simdf_load( r0, input3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) ); )
      stbIF4( stbir__simdf_load( r0, input4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) ); )
      stbIF5( stbir__simdf_load( r0, input5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) ); )
      stbIF6( stbir__simdf_load( r0, input6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) ); )
      stbIF7( stbir__simdf_load( r0, input7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) ); )

      stbir__simdf_store( output, o0 );
      output += 4;
      stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
  {
    float o0, o1, o2, o3;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; o1 = output[1] + input0[1] * c0s; o2 = output[2] + input0[2] * c0s; o3 = output[3] + input0[3] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; o1  = input0[1] * c0s; o2  = input0[2] * c0s; o3  = input0[3] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; o1 += input1[1] * c1s; o2 += input1[2] * c1s; o3 += input1[3] * c1s; )
    stbIF2( o0 += input2[0] * c2s; o1 += input2[1] * c2s; o2 += input2[2] * c2s; o3 += input2[3] * c2s; )
    stbIF3( o0 += input3[0] * c3s; o1 += input3[1] * c3s; o2 += input3[2] * c3s; o3 += input3[3] * c3s; )
    stbIF4( o0 += input4[0] * c4s; o1 += input4[1] * c4s; o2 += input4[2] * c4s; o3 += input4[3] * c4s; )
    stbIF5( o0 += input5[0] * c5s; o1 += input5[1] * c5s; o2 += input5[2] * c5s; o3 += input5[3] * c5s; )
    stbIF6( o0 += input6[0] * c6s; o1 += input6[1] * c6s; o2 += input6[2] * c6s; o3 += input6[3] * c6s; )
    stbIF7( o0 += input7[0] * c7s; o1 += input7[1] * c7s; o2 += input7[2] * c7s; o3 += input7[3] * c7s; )
    output[0] = o0; output[1] = o1; output[2] = o2; output[3] = o3;
    output += 4;
    stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input0 < input0_end )
  {
    float o0;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; )
    stbIF2( o0 += input2[0] * c2s; )
    stbIF3( o0 += input3[0] * c3s; )
    stbIF4( o0 += input4[0] * c4s; )
    stbIF5( o0 += input5[0] * c5s; )
    stbIF6( o0 += input6[0] * c6s; )
    stbIF7( o0 += input7[0] * c7s; )
    output[0] = o0;
    ++output;
    stbIF0( ++input0; ) stbIF1( ++input1; ) stbIF2( ++input2; ) stbIF3( ++input3; ) stbIF4( ++input4; ) stbIF5( ++input5; ) stbIF6( ++input6; ) stbIF7( ++input7; )
  }
}